

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transmitter_PDU.cpp
# Opt level: O1

KString * __thiscall
KDIS::PDU::Transmitter_PDU::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Transmitter_PDU *this)

{
  ostream *poVar1;
  KINT32 Value;
  KINT32 Value_00;
  KINT32 Value_01;
  KStringStream ss;
  KString local_2c0;
  KString local_2a0;
  KString local_280;
  KString local_260;
  KString local_240;
  KString local_220;
  KString local_200;
  KString local_1e0;
  KString local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  Header7::GetAsString_abi_cxx11_(&local_1c0,(Header7 *)this);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_190,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"-Transmitter PDU-\n",0x12);
  Radio_Communications_Header::GetAsString_abi_cxx11_
            (&local_1e0,&this->super_Radio_Communications_Header);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Radio Entity Type:          ",0x1c);
  DATA_TYPE::RadioEntityType::GetAsString_abi_cxx11_(&local_200,&this->m_RadioEntityType);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_200._M_dataplus._M_p,local_200._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Transmit State:             ",0x1c);
  DATA_TYPE::ENUMS::GetEnumAsStringTransmitState_abi_cxx11_
            (&local_220,(ENUMS *)(ulong)this->m_ui8TransmitterState,Value);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_220._M_dataplus._M_p,local_220._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Input Source:               ",0x1c);
  DATA_TYPE::ENUMS::GetEnumAsStringRadioInputSource_abi_cxx11_
            (&local_240,(ENUMS *)(ulong)this->m_ui8InputSource,Value_00);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_240._M_dataplus._M_p,local_240._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  DATA_TYPE::AntennaLocation::GetAsString_abi_cxx11_(&local_260,&this->m_AntennaLocation);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_260._M_dataplus._M_p,local_260._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Antenna Pattern Type:       ",0x1c);
  DATA_TYPE::ENUMS::GetEnumAsStringAntennaPatternType_abi_cxx11_
            (&local_280,(ENUMS *)(ulong)this->m_ui16AntennaPatternType,Value_01);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_280._M_dataplus._M_p,local_280._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Antenna Pattern Length:     ",0x1c);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Frequency(hertz):           ",0x1c);
  poVar1 = std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Transmit Frequency BW:      ",0x1c);
  poVar1 = std::ostream::_M_insert<double>((double)(float)this->m_f32TransmitFreqBW);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Power(decibel-milliwatts):  ",0x1c);
  poVar1 = std::ostream::_M_insert<double>((double)(float)this->m_f32Power);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  DATA_TYPE::ModulationType::GetAsString_abi_cxx11_(&local_2a0,&this->m_ModulationType);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_2a0._M_dataplus._M_p,local_2a0._M_string_length);
  DATA_TYPE::CryptoSystem::GetAsString_abi_cxx11_(&local_2c0,&this->m_CryptoSystem);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,local_2c0._M_dataplus._M_p,local_2c0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"Length Of Modulation Param: ",0x1c);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,"Variable Params.......NOT IMPLEMENTED\n",0x26);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
    operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a0._M_dataplus._M_p != &local_2a0.field_2) {
    operator_delete(local_2a0._M_dataplus._M_p,local_2a0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._M_dataplus._M_p != &local_280.field_2) {
    operator_delete(local_280._M_dataplus._M_p,local_280.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != &local_260.field_2) {
    operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != &local_240.field_2) {
    operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

KString Transmitter_PDU::GetAsString() const
{
    KStringStream ss;

    ss << Header::GetAsString()
       << "-Transmitter PDU-\n"
       << Radio_Communications_Header::GetAsString()
       << "Radio Entity Type:          " << m_RadioEntityType.GetAsString()
       << "Transmit State:             " << GetEnumAsStringTransmitState ( m_ui8TransmitterState )<< "\n"
       << "Input Source:               " << GetEnumAsStringRadioInputSource( m_ui8InputSource )   << "\n"
       << m_AntennaLocation.GetAsString()
       << "Antenna Pattern Type:       " << GetEnumAsStringAntennaPatternType( m_ui16AntennaPatternType ) << "\n"
       << "Antenna Pattern Length:     " << m_ui16AntennaPatternLength << "\n"
       << "Frequency(hertz):           " << m_ui64Freq                 << "\n"
       << "Transmit Frequency BW:      " << m_f32TransmitFreqBW        << "\n"
       << "Power(decibel-milliwatts):  " << m_f32Power                 << "\n"
       << m_ModulationType.GetAsString()
       << m_CryptoSystem.GetAsString()
       << "Length Of Modulation Param: " << ( KUINT16 )m_ui8LengthOfModulationParam << "\n"
       << "Variable Params.......NOT IMPLEMENTED\n";

    // TODO: Interpretation of the variable params is not provided at the moment. Karl

    return ss.str();
}